

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O1

bool __thiscall draco::CornerTable::ComputeVertexCorners(CornerTable *this,int num_vertices)

{
  iterator __position;
  iterator __position_00;
  pointer pIVar1;
  pointer pIVar2;
  pointer pIVar3;
  bool bVar4;
  ulong *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int k;
  long lVar13;
  uint uVar14;
  VertexIndex v;
  vector<bool,_std::allocator<bool>_> visited_vertices;
  vector<bool,_std::allocator<bool>_> visited_corners;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_a0;
  allocator_type local_99;
  vector<bool,_std::allocator<bool>_> local_98;
  vector<bool,_std::allocator<bool>_> local_70;
  vector<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>>>
  *local_48;
  vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
  *local_40;
  ulong local_38;
  ulong uVar15;
  
  this->num_original_vertices_ = num_vertices;
  local_40 = (vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
              *)&this->vertex_corners_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::resize((vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            *)local_40,(long)num_vertices,(value_type *)&kInvalidCornerIndex);
  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       ((ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_98,(long)num_vertices,(bool *)&local_70,(allocator_type *)&local_a0);
  local_a0.value_ = local_a0.value_ & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_70,
             (long)(int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->corner_to_vertex_map_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 2),
             (bool *)&local_a0,&local_99);
  if ((int)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->corner_to_vertex_map_).vector_.
                          super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) / 3) != 0) {
    local_48 = (vector<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>>>
                *)&this->non_manifold_vertex_parents_;
    uVar11 = 0;
    do {
      bVar4 = IsDegenerated(this,(FaceIndex)(uint)uVar11);
      local_38 = uVar11;
      if (!bVar4) {
        lVar13 = 0;
        do {
          uVar14 = (uint)uVar11 * 3 + (int)lVar13;
          uVar15 = (ulong)uVar14;
          if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar15 & 0x3f) & 1) == 0) {
            local_a0.value_ =
                 (this->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar15].value_;
            uVar12 = 1L << ((byte)local_a0.value_ & 0x3f) &
                     local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [local_a0.value_ >> 6];
            uVar8 = num_vertices;
            if (uVar12 != 0) {
              __position._M_current =
                   (this->vertex_corners_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->vertex_corners_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>const&>
                          (local_40,__position,
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                           &kInvalidCornerIndex);
              }
              else {
                (__position._M_current)->value_ = 0xffffffff;
                (this->vertex_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
              __position_00._M_current =
                   (this->non_manifold_vertex_parents_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (__position_00._M_current ==
                  (this->non_manifold_vertex_parents_).vector_.
                  super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>>>
                ::
                _M_realloc_insert<draco::IndexType<unsigned_int,draco::VertexIndex_tag_type_>const&>
                          (local_48,__position_00,&local_a0);
              }
              else {
                (__position_00._M_current)->value_ = local_a0.value_;
                (this->non_manifold_vertex_parents_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_98,false);
              uVar8 = num_vertices + 1;
              local_a0.value_ = num_vertices;
            }
            local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[local_a0.value_ >> 6] =
                 local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [local_a0.value_ >> 6] | 1L << ((byte)local_a0.value_ & 0x3f);
            pIVar1 = (this->vertex_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pIVar2 = (this->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pIVar3 = (this->opposite_corners_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = uVar14;
            do {
              if (uVar6 == 0xffffffff) break;
              local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
                   local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] |
                   1L << ((byte)uVar6 & 0x3f);
              pIVar1[local_a0.value_].value_ = uVar6;
              if (uVar12 != 0) {
                pIVar2[uVar6].value_ = local_a0.value_;
              }
              uVar7 = uVar6 - 2;
              if (0x55555555 < (uVar6 + 1) * -0x55555555) {
                uVar7 = uVar6 + 1;
              }
              if (uVar7 != 0xffffffff) {
                uVar7 = pIVar3[uVar7].value_;
              }
              uVar6 = uVar7;
              if (uVar7 != 0xffffffff) {
                uVar6 = uVar7 - 2;
                if (0x55555555 < (uVar7 + 1) * -0x55555555) {
                  uVar6 = uVar7 + 1;
                }
              }
            } while (uVar6 != uVar14);
            num_vertices = uVar8;
            if (uVar6 == 0xffffffff) {
              if (uVar14 != 0xffffffff) {
                uVar15 = (ulong)(((uVar14 * -0x55555555 < 0x55555556) - 1 | 2) + uVar14);
              }
              if ((int)uVar15 != -1) {
                uVar15 = (ulong)(this->opposite_corners_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar15].value_;
              }
              iVar9 = (int)uVar15;
              if (iVar9 != -1) {
                uVar15 = (ulong)((((uint)(iVar9 * -0x55555555) < 0x55555556) - 1 | 2) + iVar9);
              }
              if ((int)uVar15 != -1) {
                pIVar2 = (this->corner_to_vertex_map_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pIVar1 = (this->opposite_corners_).vector_.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                do {
                  local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6] =
                       local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar15 >> 6]
                       | 1L << ((byte)uVar15 & 0x3f);
                  if (uVar12 != 0) {
                    pIVar2[uVar15].value_ = local_a0.value_;
                  }
                  uVar14 = (((uint)((int)uVar15 * -0x55555555) < 0x55555556) - 1 | 2) + (int)uVar15;
                  if (uVar14 != 0xffffffff) {
                    uVar14 = pIVar1[uVar14].value_;
                  }
                  if (uVar14 != 0xffffffff) {
                    uVar14 = uVar14 + ((uVar14 * -0x55555555 < 0x55555556) - 1 | 2);
                  }
                  uVar15 = (ulong)uVar14;
                } while (uVar14 != 0xffffffff);
              }
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
      }
      uVar14 = (int)local_38 + 1;
      uVar11 = (ulong)uVar14;
    } while (uVar14 < (uint)((ulong)((long)(this->corner_to_vertex_map_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this->corner_to_vertex_map_).vector_.
                                           super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 2) / 3));
  }
  this->num_isolated_vertices_ = 0;
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_offset != 0 ||
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p !=
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
      .super__Bit_iterator_base._M_p) {
    uVar11 = 0;
    iVar9 = 0;
    puVar5 = local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p;
    do {
      if ((*puVar5 >> (uVar11 & 0x3f) & 1) == 0) {
        iVar9 = iVar9 + 1;
        this->num_isolated_vertices_ = iVar9;
      }
      iVar10 = (int)uVar11;
      puVar5 = puVar5 + (iVar10 == 0x3f);
      uVar11 = (ulong)(iVar10 + 1);
      if (iVar10 == 0x3f) {
        uVar11 = 0;
      }
    } while ((uint)uVar11 !=
             local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset ||
             puVar5 != local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
  }
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return true;
}

Assistant:

bool CornerTable::ComputeVertexCorners(int num_vertices) {
  DRACO_DCHECK(GetValenceCache().IsCacheEmpty());
  num_original_vertices_ = num_vertices;
  vertex_corners_.resize(num_vertices, kInvalidCornerIndex);
  // Arrays for marking visited vertices and corners that allow us to detect
  // non-manifold vertices.
  std::vector<bool> visited_vertices(num_vertices, false);
  std::vector<bool> visited_corners(num_corners(), false);

  for (FaceIndex f(0); f < num_faces(); ++f) {
    const CornerIndex first_face_corner = FirstCorner(f);
    // Check whether the face is degenerated. If so ignore it.
    if (IsDegenerated(f)) {
      continue;
    }

    for (int k = 0; k < 3; ++k) {
      const CornerIndex c = first_face_corner + k;
      if (visited_corners[c.value()]) {
        continue;
      }
      VertexIndex v = corner_to_vertex_map_[c];
      // Note that one vertex maps to many corners, but we just keep track
      // of the vertex which has a boundary on the left if the vertex lies on
      // the boundary. This means that all the related corners can be accessed
      // by iterating over the SwingRight() operator.
      // In case of a vertex inside the mesh, the choice is arbitrary.
      bool is_non_manifold_vertex = false;
      if (visited_vertices[v.value()]) {
        // A visited vertex of an unvisited corner found. Must be a non-manifold
        // vertex.
        // Create a new vertex for it.
        vertex_corners_.push_back(kInvalidCornerIndex);
        non_manifold_vertex_parents_.push_back(v);
        visited_vertices.push_back(false);
        v = VertexIndex(num_vertices++);
        is_non_manifold_vertex = true;
      }
      // Mark the vertex as visited.
      visited_vertices[v.value()] = true;

      // First swing all the way to the left and mark all corners on the way.
      CornerIndex act_c(c);
      while (act_c != kInvalidCornerIndex) {
        visited_corners[act_c.value()] = true;
        // Vertex will eventually point to the left most corner.
        vertex_corners_[v] = act_c;
        if (is_non_manifold_vertex) {
          // Update vertex index in the corresponding face.
          corner_to_vertex_map_[act_c] = v;
        }
        act_c = SwingLeft(act_c);
        if (act_c == c) {
          break;  // Full circle reached.
        }
      }
      if (act_c == kInvalidCornerIndex) {
        // If we have reached an open boundary we need to swing right from the
        // initial corner to mark all corners in the opposite direction.
        act_c = SwingRight(c);
        while (act_c != kInvalidCornerIndex) {
          visited_corners[act_c.value()] = true;
          if (is_non_manifold_vertex) {
            // Update vertex index in the corresponding face.
            corner_to_vertex_map_[act_c] = v;
          }
          act_c = SwingRight(act_c);
        }
      }
    }
  }

  // Count the number of isolated (unprocessed) vertices.
  num_isolated_vertices_ = 0;
  for (bool visited : visited_vertices) {
    if (!visited) {
      ++num_isolated_vertices_;
    }
  }
  return true;
}